

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cc
# Opt level: O3

string * GetDatetimeWithoutSpecialChars_abi_cxx11_(void)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  string *in_RDI;
  
  GetDatetime_abi_cxx11_();
  sVar1 = in_RDI->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (in_RDI->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == ' ') {
        pcVar2[sVar3] = '_';
      }
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
    sVar1 = in_RDI->_M_string_length;
    if (sVar1 != 0) {
      pcVar2 = (in_RDI->_M_dataplus)._M_p;
      sVar3 = 0;
      do {
        if (pcVar2[sVar3] == ':') {
          pcVar2[sVar3] = '.';
        }
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
  }
  return in_RDI;
}

Assistant:

string GetDatetimeWithoutSpecialChars()
{
    string datetime(GetDatetime());
    std::replace(datetime.begin(), datetime.end(), ' ', '_');
    std::replace(datetime.begin(), datetime.end(), ':', '.');
    return datetime;
}